

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QSslCertificate>::emplace<QSslCertificate_const&>
          (QMovableArrayOps<QSslCertificate> *this,qsizetype i,QSslCertificate *args)

{
  QSslCertificate **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  QSslCertificate QVar5;
  qsizetype qVar6;
  long in_FS_OFFSET;
  bool bVar7;
  Inserter IStack_58;
  QSslCertificate tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QSslCertificate>).super_QArrayDataPointer<QSslCertificate>.
           d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QSslCertificate>).super_QArrayDataPointer<QSslCertificate>.
        size == i) {
      qVar6 = QArrayDataPointer<QSslCertificate>::freeSpaceAtEnd
                        ((QArrayDataPointer<QSslCertificate> *)this);
      if (qVar6 == 0) goto LAB_0010a256;
      QSslCertificate::QSslCertificate
                ((this->super_QGenericArrayOps<QSslCertificate>).
                 super_QArrayDataPointer<QSslCertificate>.ptr +
                 (this->super_QGenericArrayOps<QSslCertificate>).
                 super_QArrayDataPointer<QSslCertificate>.size,args);
LAB_0010a340:
      pqVar2 = &(this->super_QGenericArrayOps<QSslCertificate>).
                super_QArrayDataPointer<QSslCertificate>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_0010a2ff;
    }
LAB_0010a256:
    if (i == 0) {
      qVar6 = QArrayDataPointer<QSslCertificate>::freeSpaceAtBegin
                        ((QArrayDataPointer<QSslCertificate> *)this);
      if (qVar6 != 0) {
        QSslCertificate::QSslCertificate
                  ((this->super_QGenericArrayOps<QSslCertificate>).
                   super_QArrayDataPointer<QSslCertificate>.ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QSslCertificate>).
                   super_QArrayDataPointer<QSslCertificate>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_0010a340;
      }
    }
  }
  tmp.d.d.ptr = (QExplicitlySharedDataPointer<QSslCertificatePrivate>)
                (totally_ordered_wrapper<QSslCertificatePrivate_*>)0xaaaaaaaaaaaaaaaa;
  QSslCertificate::QSslCertificate(&tmp,args);
  bVar7 = (this->super_QGenericArrayOps<QSslCertificate>).super_QArrayDataPointer<QSslCertificate>.
          size != 0;
  QArrayDataPointer<QSslCertificate>::detachAndGrow
            ((QArrayDataPointer<QSslCertificate> *)this,(uint)(i == 0 && bVar7),1,
             (QSslCertificate **)0x0,(QArrayDataPointer<QSslCertificate> *)0x0);
  QVar5 = tmp;
  if (i == 0 && bVar7) {
    tmp.d.d.ptr = (QExplicitlySharedDataPointer<QSslCertificatePrivate>)
                  (totally_ordered_wrapper<QSslCertificatePrivate_*>)0x0;
    (this->super_QGenericArrayOps<QSslCertificate>).super_QArrayDataPointer<QSslCertificate>.ptr[-1]
    .d.d.ptr = (QSslCertificatePrivate *)QVar5.d.d.ptr;
    ppQVar1 = &(this->super_QGenericArrayOps<QSslCertificate>).
               super_QArrayDataPointer<QSslCertificate>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QSslCertificate>).
              super_QArrayDataPointer<QSslCertificate>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&IStack_58,(QArrayDataPointer<QSslCertificate> *)this,i,1);
    QVar5 = tmp;
    tmp.d.d.ptr = (QExplicitlySharedDataPointer<QSslCertificatePrivate>)
                  (totally_ordered_wrapper<QSslCertificatePrivate_*>)0x0;
    ((IStack_58.displaceFrom)->d).d.ptr = (QSslCertificatePrivate *)QVar5.d.d.ptr;
    IStack_58.displaceFrom = IStack_58.displaceFrom + 1;
    Inserter::~Inserter(&IStack_58);
  }
  QSslCertificate::~QSslCertificate(&tmp);
LAB_0010a2ff:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }